

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# strcase.c
# Opt level: O3

int curl_strnequal(char *first,char *second,size_t max)

{
  byte bVar1;
  ulong uVar2;
  byte *pbVar3;
  bool bVar4;
  
  if (second == (char *)0x0 || first == (char *)0x0) {
    bVar4 = max != 0 && (first == (char *)0x0 && second == (char *)0x0);
  }
  else {
    bVar1 = *first;
    if (bVar1 == 0) {
      uVar2 = 0;
    }
    else {
      pbVar3 = (byte *)(first + 1);
      do {
        if (((ulong)(byte)*second == 0) || (max == 0)) goto LAB_001582f5;
        if (""[bVar1] != ""[(byte)*second]) {
          bVar4 = false;
          goto LAB_0015832c;
        }
        max = max - 1;
        second = (char *)((byte *)second + 1);
        bVar1 = *pbVar3;
        pbVar3 = pbVar3 + 1;
      } while (bVar1 != 0);
      bVar1 = 0;
LAB_001582f5:
      uVar2 = (ulong)bVar1;
    }
    if (max == 0) {
      bVar4 = true;
    }
    else {
      bVar4 = ""[uVar2] == ""[(byte)*second];
    }
  }
LAB_0015832c:
  return (int)bVar4;
}

Assistant:

int curl_strnequal(const char *first, const char *second, size_t max)
{
  if(first && second)
    /* both pointers point to something then compare them */
    return ncasecompare(first, second, max);

  /* if both pointers are NULL then treat them as equal if max is non-zero */
  return (NULL == first && NULL == second && max);
}